

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ApiQueryPhrase(Fts5Context *pCtx,int iPhrase,void *pUserData,
                      _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *xCallback)

{
  sqlite3_vtab *pVTab;
  int *__src;
  char *__s;
  Fts5Config *pFVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Fts5Expr *pFVar5;
  Fts5ExprPhrase **ppFVar6;
  Fts5ExprNode *pFVar7;
  Fts5ExprNearset *pFVar8;
  Fts5Colset *__dest;
  Fts5ExprPhrase *pPhrase;
  size_t sVar9;
  code *pcVar10;
  Fts5Context *pFVar11;
  Fts5Context *pCursor;
  int in_R8D;
  int in_R9D;
  long *plVar12;
  long lVar13;
  Fts5Cursor *pNew;
  int local_9c;
  long *local_98;
  Fts5Expr *local_90;
  long *local_88;
  Fts5Context *local_80;
  sqlite3_vtab *local_78;
  void *local_70;
  Fts5ExprPhrase *local_68;
  undefined8 uStack_60;
  _func_int_Fts5ExtensionApi_ptr_Fts5Context_ptr_void_ptr *local_50;
  undefined8 *local_48;
  long *local_40;
  Fts5Context *local_38;
  
  local_88 = (long *)CONCAT44(local_88._4_4_,iPhrase);
  pVTab = *(sqlite3_vtab **)pCtx;
  local_38 = (Fts5Context *)0x0;
  iVar3 = fts5OpenMethod(pVTab,(sqlite3_vtab_cursor **)&local_38);
  pFVar11 = local_38;
  pCursor = local_38;
  if (iVar3 != 0) goto LAB_001be9f6;
  *(undefined4 *)&local_38[0x20].field_0x0 = 1;
  *(sqlite3_vtab **)&local_38[0x28].field_0x0 = (sqlite3_vtab *)0x8000000000000000;
  *(sqlite3_vtab **)&local_38[0x30].field_0x0 = (sqlite3_vtab *)0x7fffffffffffffff;
  *(sqlite3_vtab **)&local_38->field_0x0 = pVTab;
  local_48 = *(undefined8 **)(pCtx + 0x40);
  local_9c = 0;
  local_68 = (Fts5ExprPhrase *)0x0;
  uStack_60 = 0;
  local_98 = *(long **)(local_48[4] + (long)(int)local_88 * 8);
  local_78 = pVTab;
  local_70 = pUserData;
  pFVar5 = (Fts5Expr *)sqlite3Fts5MallocZero(&local_9c,0x28);
  local_90 = pFVar5;
  if (local_9c == 0) {
    ppFVar6 = (Fts5ExprPhrase **)sqlite3Fts5MallocZero(&local_9c,8);
    pFVar5->apExprPhrase = ppFVar6;
    if (local_9c == 0) {
      pFVar7 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_9c,0x38);
      pFVar5->pRoot = pFVar7;
      if (local_9c == 0) {
        pFVar8 = (Fts5ExprNearset *)sqlite3Fts5MallocZero(&local_9c,0x28);
        pFVar5->pRoot->pNear = pFVar8;
        if ((local_9c == 0) &&
           (__src = *(int **)(*(long *)(*local_98 + 0x20) + 8), __src != (int *)0x0)) {
          sVar9 = (long)*__src * 4 + 4;
          __dest = (Fts5Colset *)sqlite3Fts5MallocZero(&local_9c,sVar9);
          if (__dest != (Fts5Colset *)0x0) {
            memcpy(__dest,__src,sVar9);
          }
          local_90->pRoot->pNear->pColset = __dest;
        }
      }
    }
  }
  if ((int)local_98[3] == 0) {
    pPhrase = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&local_9c,0x40);
    iVar3 = local_9c;
    if (local_9c == 0) {
      iVar3 = (int)local_98[3];
      goto LAB_001be8f3;
    }
  }
  else {
    if (local_9c == 0) {
      local_80 = pFVar11;
      local_40 = local_98 + 4;
      lVar13 = 0;
      local_50 = xCallback;
      do {
        plVar12 = local_40 + lVar13 * 4;
        iVar4 = 0;
        local_88 = plVar12;
        do {
          __s = (char *)plVar12[1];
          sVar9 = strlen(__s);
          iVar3 = fts5ParseTokenize(&local_68,iVar4,__s,(int)sVar9,in_R8D,in_R9D);
          plVar12 = (long *)plVar12[3];
          if (plVar12 == (long *)0x0) break;
          iVar4 = 1;
        } while (iVar3 == 0);
        pFVar11 = local_80;
        pPhrase = local_68;
        if (iVar3 != 0) goto LAB_001be9dc;
        local_68->aTerm[lVar13].bPrefix = (u8)*local_88;
        local_68->aTerm[lVar13].bFirst = *(u8 *)((long)local_88 + 1);
        lVar13 = lVar13 + 1;
        iVar3 = (int)local_98[3];
        xCallback = local_50;
      } while (lVar13 < iVar3);
LAB_001be8f3:
      pCursor = local_38;
      pvVar2 = local_70;
      pFVar1 = (Fts5Config *)local_48[1];
      local_90->pIndex = (Fts5Index *)*local_48;
      local_90->pConfig = pFVar1;
      local_90->nPhrase = 1;
      *local_90->apExprPhrase = pPhrase;
      local_90->pRoot->pNear->apPhrase[0] = pPhrase;
      pFVar7 = local_90->pRoot;
      pFVar7->pNear->nPhrase = 1;
      pPhrase->pNode = pFVar7;
      if (((iVar3 == 1) && (local_98[7] == 0)) && (*(char *)((long)local_98 + 0x21) == '\0')) {
        pcVar10 = fts5ExprNodeNext_TERM;
        iVar3 = 4;
      }
      else {
        pcVar10 = fts5ExprNodeNext_STRING;
        iVar3 = 9;
      }
      pFVar7->eType = iVar3;
      pFVar7->xNext = pcVar10;
      *(Fts5Expr **)&pFVar11[0x40].field_0x0 = local_90;
      pFVar5 = *(Fts5Expr **)&local_38[0x40].field_0x0;
      iVar3 = sqlite3Fts5ExprFirst
                        (pFVar5,*(Fts5Index **)&local_78[1].nRef,*(i64 *)&local_38[0x28].field_0x0,0
                        );
      *(uint *)&pCursor[0x50].field_0x0 =
           (uint)(pFVar5->pRoot->bEof != 0) | *(uint *)&pCursor[0x50].field_0x0 | 0x4e;
      while (iVar3 == 0) {
        if ((pCursor[0x50].field_0x0 & 1) != 0) {
          iVar3 = 0;
          break;
        }
        iVar4 = (*xCallback)(&sFts5Api,pCursor,pvVar2);
        if (iVar4 != 0) {
          iVar3 = 0;
          if (iVar4 != 0x65) {
            iVar3 = iVar4;
          }
          break;
        }
        iVar3 = fts5NextMethod((sqlite3_vtab_cursor *)pCursor);
      }
      goto LAB_001be9f6;
    }
    pPhrase = (Fts5ExprPhrase *)0x0;
    iVar3 = local_9c;
  }
LAB_001be9dc:
  sqlite3Fts5ExprFree(local_90);
  fts5ExprPhraseFree(pPhrase);
  *(sqlite3_vtab **)&pFVar11[0x40].field_0x0 = (sqlite3_vtab *)0x0;
  pCursor = pFVar11;
LAB_001be9f6:
  fts5CloseMethod((sqlite3_vtab_cursor *)pCursor);
  return iVar3;
}

Assistant:

static int fts5ApiQueryPhrase(
  Fts5Context *pCtx, 
  int iPhrase, 
  void *pUserData,
  int(*xCallback)(const Fts5ExtensionApi*, Fts5Context*, void*)
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  int rc;
  Fts5Cursor *pNew = 0;

  rc = fts5OpenMethod(pCsr->base.pVtab, (sqlite3_vtab_cursor**)&pNew);
  if( rc==SQLITE_OK ){
    pNew->ePlan = FTS5_PLAN_MATCH;
    pNew->iFirstRowid = SMALLEST_INT64;
    pNew->iLastRowid = LARGEST_INT64;
    pNew->base.pVtab = (sqlite3_vtab*)pTab;
    rc = sqlite3Fts5ExprClonePhrase(pCsr->pExpr, iPhrase, &pNew->pExpr);
  }

  if( rc==SQLITE_OK ){
    for(rc = fts5CursorFirst(pTab, pNew, 0);
        rc==SQLITE_OK && CsrFlagTest(pNew, FTS5CSR_EOF)==0;
        rc = fts5NextMethod((sqlite3_vtab_cursor*)pNew)
    ){
      rc = xCallback(&sFts5Api, (Fts5Context*)pNew, pUserData);
      if( rc!=SQLITE_OK ){
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        break;
      }
    }
  }

  fts5CloseMethod((sqlite3_vtab_cursor*)pNew);
  return rc;
}